

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O2

void __thiscall
pfederc::UnOpExpr::UnOpExpr
          (UnOpExpr *this,Lexer *lexer,Position *pos,Token *tokOp,
          unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *expr)

{
  Expr *pEVar1;
  size_t sVar2;
  bool bVar3;
  
  (this->super_Expr).parent = (Expr *)0x0;
  (this->super_Expr).lexer = lexer;
  (this->super_Expr).type = EXPR_UNOP;
  sVar2 = pos->startIndex;
  (this->super_Expr).pos.line = pos->line;
  (this->super_Expr).pos.startIndex = sVar2;
  (this->super_Expr).pos.endIndex = pos->endIndex;
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__UnOpExpr_0012b9c0;
  this->tokOp = tokOp;
  (this->expr)._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
       (expr->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
       super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  (expr->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl = (Expr *)0x0;
  if (this->tokOp == (Token *)0x0) {
    __assert_fail("this->tokOp",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                  ,0x35c,
                  "pfederc::UnOpExpr::UnOpExpr(const Lexer &, const Position &, const Token *, std::unique_ptr<Expr> &&)"
                 );
  }
  bVar3 = isTokenTypeOperator(this->tokOp->type);
  if (bVar3) {
    pEVar1 = (this->expr)._M_t.
             super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
             super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
             super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
    if (pEVar1 != (Expr *)0x0) {
      pEVar1->parent = &this->super_Expr;
      return;
    }
    __assert_fail("!!this->expr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                  ,0x35e,
                  "pfederc::UnOpExpr::UnOpExpr(const Lexer &, const Position &, const Token *, std::unique_ptr<Expr> &&)"
                 );
  }
  __assert_fail("isTokenTypeOperator(this->tokOp->getType())",
                "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                ,0x35d,
                "pfederc::UnOpExpr::UnOpExpr(const Lexer &, const Position &, const Token *, std::unique_ptr<Expr> &&)"
               );
}

Assistant:

Expr::Expr(const Lexer &lexer, ExprType type, const Position &pos) noexcept
    : parent{nullptr}, lexer{lexer}, type{type}, pos(pos) {

}